

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O3

vector<char,_std::allocator<char>_> * __thiscall
cnpy::create_npy_header<std::complex<double>>
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,cnpy *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *shape)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<char,_std::allocator<char>_> dict;
  string __str_1;
  string __str;
  value_type local_b9;
  vector<char,_std::allocator<char>_> local_b8;
  vector *local_98;
  char *local_90;
  uint local_88;
  char local_80 [16];
  char *local_70;
  uint local_68;
  char local_60 [16];
  undefined2 *local_50 [2];
  undefined2 local_40 [8];
  
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cnpy::operator+=((vector *)&local_b8,"{\'descr\': \'");
  cVar3 = cnpy::BigEndianTest();
  operator+=(&local_b8,cVar3);
  cVar3 = cnpy::map_type((type_info *)&std::complex<double>::typeinfo);
  operator+=(&local_b8,cVar3);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x02');
  *local_50[0] = 0x3631;
  cnpy::operator+=(&local_b8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  cnpy::operator+=((vector *)&local_b8,"\', \'fortran_order\': False, \'shape\': (");
  uVar4 = **(ulong **)this;
  cVar3 = '\x01';
  if (9 < uVar4) {
    uVar6 = uVar4;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar6 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_001055a1;
      }
      if (uVar6 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_001055a1;
      }
      if (uVar6 < 10000) goto LAB_001055a1;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_001055a1:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_70,local_68,uVar4);
  cnpy::operator+=(&local_b8,&local_70);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  uVar4 = *(long *)(this + 8) - *(long *)this;
  local_98 = (vector *)__return_storage_ptr__;
  if (8 < uVar4) {
    uVar6 = 1;
    do {
      cnpy::operator+=((vector *)&local_b8,", ");
      uVar4 = *(ulong *)(*(long *)this + uVar6 * 8);
      cVar3 = '\x01';
      if (9 < uVar4) {
        uVar5 = uVar4;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          if (uVar5 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_00105680;
          }
          if (uVar5 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_00105680;
          }
          if (uVar5 < 10000) goto LAB_00105680;
          bVar1 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (bVar1);
        cVar3 = cVar3 + '\x01';
      }
LAB_00105680:
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,cVar3);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_90,local_88,uVar4);
      cnpy::operator+=((vector *)&local_b8,&local_90);
      __return_storage_ptr__ = (vector<char,_std::allocator<char>_> *)local_98;
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      uVar4 = *(long *)(this + 8) - *(long *)this;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)uVar4 >> 3));
  }
  if (uVar4 == 8) {
    cnpy::operator+=((vector *)&local_b8,",");
  }
  cnpy::operator+=((vector *)&local_b8,"), }");
  local_b9 = ' ';
  std::vector<char,_std::allocator<char>_>::_M_fill_insert
            (&local_b8,
             (iterator)
             local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             0x10 - (ulong)(((int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (int)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start) + 10U & 0xf),&local_b9);
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
  [-1] = '\n';
  *(undefined8 *)__return_storage_ptr__ = 0;
  *(undefined8 *)((long)__return_storage_ptr__ + 8) = 0;
  *(undefined8 *)((long)__return_storage_ptr__ + 0x10) = 0;
  operator+=(__return_storage_ptr__,-0x6d);
  cnpy::operator+=((vector *)__return_storage_ptr__,"NUMPY");
  operator+=(__return_storage_ptr__,'\x01');
  operator+=(__return_storage_ptr__,'\0');
  operator+=(__return_storage_ptr__,
             (short)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (short)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
             *(undefined8 *)((long)__return_storage_ptr__ + 8),
             local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (vector<char,_std::allocator<char>_> *)(vector *)__return_storage_ptr__;
}

Assistant:

std::vector<char> create_npy_header(const std::vector<size_t>& shape) {  

        std::vector<char> dict;
        dict += "{'descr': '";
        dict += BigEndianTest();
        dict += map_type(typeid(T));
        dict += std::to_string(sizeof(T));
        dict += "', 'fortran_order': False, 'shape': (";
        dict += std::to_string(shape[0]);
        for(size_t i = 1;i < shape.size();i++) {
            dict += ", ";
            dict += std::to_string(shape[i]);
        }
        if(shape.size() == 1) dict += ",";
        dict += "), }";
        //pad with spaces so that preamble+dict is modulo 16 bytes. preamble is 10 bytes. dict needs to end with \n
        int remainder = 16 - (10 + dict.size()) % 16;
        dict.insert(dict.end(),remainder,' ');
        dict.back() = '\n';

        std::vector<char> header;
        header += (char) 0x93;
        header += "NUMPY";
        header += (char) 0x01; //major version of numpy format
        header += (char) 0x00; //minor version of numpy format
        header += (uint16_t) dict.size();
        header.insert(header.end(),dict.begin(),dict.end());

        return header;
    }